

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOMaterial.cpp
# Opt level: O0

void __thiscall Assimp::LWOImporter::LoadLWO2Surface(LWOImporter *this,uint size)

{
  vector<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_> *this_00;
  bool bVar1;
  __type _Var2;
  uint16_t uVar3;
  uint32_t uVar4;
  reference this_01;
  long lVar5;
  reference pSVar6;
  Logger *pLVar7;
  DeadlyImportError *pDVar8;
  float fVar9;
  double dVar10;
  SubChunkHeader local_444;
  SubChunkHeader head2;
  allocator local_411;
  string local_410;
  undefined1 local_3ea;
  allocator local_3e9;
  string local_3e8;
  undefined1 local_3c2;
  allocator local_3c1;
  string local_3c0;
  undefined1 local_39a;
  allocator local_399;
  string local_398;
  undefined1 local_372;
  allocator local_371;
  string local_370;
  undefined1 local_34a;
  allocator local_349;
  string local_348;
  undefined1 local_322;
  allocator local_321;
  string local_320;
  undefined1 local_2fa;
  allocator local_2f9;
  string local_2f8;
  undefined1 local_2d2;
  allocator local_2d1;
  string local_2d0;
  undefined1 local_2aa;
  allocator local_2a9;
  string local_2a8;
  undefined1 local_282;
  allocator local_281;
  string local_280;
  undefined1 local_25a;
  allocator local_259;
  string local_258;
  undefined1 local_232;
  allocator local_231;
  string local_230;
  uint8_t *local_210;
  uint8_t *next;
  string local_200;
  SubChunkHeader local_1e0;
  SubChunkHeader head;
  __normal_iterator<Assimp::LWO::Surface_*,_std::vector<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>_>
  local_1b8;
  __normal_iterator<Assimp::LWO::Surface_*,_std::vector<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>_>
  local_1b0;
  iterator end_1;
  iterator it;
  string derived;
  Surface *surf;
  Surface local_168;
  uint8_t *local_20;
  uint8_t *end;
  LWOImporter *pLStack_10;
  uint size_local;
  LWOImporter *this_local;
  
  local_20 = this->mFileBuffer + size;
  this_00 = this->mSurfaces;
  end._4_4_ = size;
  pLStack_10 = this;
  LWO::Surface::Surface(&local_168);
  std::vector<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>::push_back
            (this_00,&local_168);
  LWO::Surface::~Surface(&local_168);
  this_01 = std::vector<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>::back
                      (this->mSurfaces);
  GetS0(this,&this_01->mName,end._4_4_);
  std::__cxx11::string::string((string *)&it);
  GetS0(this,(string *)&it,(int)local_20 - *(int *)&this->mFileBuffer);
  lVar5 = std::__cxx11::string::length();
  if (lVar5 != 0) {
    end_1 = std::vector<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>::begin
                      (this->mSurfaces);
    local_1b8._M_current =
         (Surface *)
         std::vector<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>::end
                   (this->mSurfaces);
    local_1b0 = __gnu_cxx::
                __normal_iterator<Assimp::LWO::Surface_*,_std::vector<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>_>
                ::operator-(&local_1b8,1);
    while (bVar1 = __gnu_cxx::operator!=(&end_1,&local_1b0), bVar1) {
      pSVar6 = __gnu_cxx::
               __normal_iterator<Assimp::LWO::Surface_*,_std::vector<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>_>
               ::operator*(&end_1);
      _Var2 = std::operator==(&pSVar6->mName,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &it);
      if (_Var2) {
        pSVar6 = __gnu_cxx::
                 __normal_iterator<Assimp::LWO::Surface_*,_std::vector<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>_>
                 ::operator*(&end_1);
        LWO::Surface::operator=(this_01,pSVar6);
        std::__cxx11::string::clear();
        break;
      }
      __gnu_cxx::
      __normal_iterator<Assimp::LWO::Surface_*,_std::vector<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>_>
      ::operator++(&end_1);
    }
    lVar5 = std::__cxx11::string::size();
    if (lVar5 != 0) {
      pLVar7 = DefaultLogger::get();
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&head,
                     "LWO2: Unable to find source surface: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it);
      Logger::warn(pLVar7,(string *)&head);
      std::__cxx11::string::~string((string *)&head);
    }
  }
  while( true ) {
    if (local_20 <= this->mFileBuffer + 6) {
      std::__cxx11::string::~string((string *)&it);
      return;
    }
    local_1e0 = IFF::LoadSubChunk(&this->mFileBuffer);
    if (local_20 < this->mFileBuffer + (int)(uint)local_1e0.length) break;
    local_210 = this->mFileBuffer + local_1e0.length;
    if (local_1e0.type == 0x41445452) {
      if (local_1e0.length < 4) {
        local_2d2 = 1;
        pDVar8 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_2d0,"LWO: ADTR chunk is too small",&local_2d1)
        ;
        DeadlyImportError::DeadlyImportError(pDVar8,&local_2d0);
        local_2d2 = 0;
        __cxa_throw(pDVar8,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      fVar9 = GetF4(this);
      this_01->mAdditiveTransparency = fVar9;
    }
    else if (local_1e0.type == 0x424c4f4b) {
      if (local_1e0.length < 4) {
        head2.type._2_1_ = 1;
        pDVar8 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&head2.length,"LWO: BLOK chunk is too small",
                   (allocator *)((long)&head2.type + 3));
        DeadlyImportError::DeadlyImportError(pDVar8,(string *)&head2.length);
        head2.type._2_1_ = 0;
        __cxa_throw(pDVar8,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      local_444 = IFF::LoadSubChunk(&this->mFileBuffer);
      if (((local_444.type == 0x47524144) || (local_444.type == 0x494d4150)) ||
         (local_444.type == 0x50524f43)) {
        LoadLWO2TextureBlock(this,&local_444,(uint)local_1e0.length);
      }
      else if (local_444.type == 0x53484452) {
        LoadLWO2ShaderBlock(this,&local_444,(uint)local_1e0.length);
      }
      else {
        pLVar7 = DefaultLogger::get();
        Logger::warn(pLVar7,"LWO2: Found an unsupported surface BLOK");
      }
    }
    else if (local_1e0.type == 0x42554d50) {
      if (local_1e0.length < 4) {
        local_34a = 1;
        pDVar8 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_348,"LWO: BUMP chunk is too small",&local_349)
        ;
        DeadlyImportError::DeadlyImportError(pDVar8,&local_348);
        local_34a = 0;
        __cxa_throw(pDVar8,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      fVar9 = GetF4(this);
      this_01->mBumpIntensity = fVar9;
    }
    else if (local_1e0.type == 0x434c5248) {
      if (local_1e0.length < 4) {
        local_372 = 1;
        pDVar8 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_370,"LWO: CLRH chunk is too small",&local_371)
        ;
        DeadlyImportError::DeadlyImportError(pDVar8,&local_370);
        local_372 = 0;
        __cxa_throw(pDVar8,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      fVar9 = GetF4(this);
      this_01->mColorHighlights = fVar9;
    }
    else if (local_1e0.type == 0x434f4c52) {
      if (local_1e0.length < 0xc) {
        local_232 = 1;
        pDVar8 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_230,"LWO: COLR chunk is too small",&local_231)
        ;
        DeadlyImportError::DeadlyImportError(pDVar8,&local_230);
        local_232 = 0;
        __cxa_throw(pDVar8,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      fVar9 = GetF4(this);
      (this_01->mColor).r = fVar9;
      fVar9 = GetF4(this);
      (this_01->mColor).g = fVar9;
      fVar9 = GetF4(this);
      (this_01->mColor).b = fVar9;
    }
    else if (local_1e0.type == 0x44494646) {
      if (local_1e0.length < 4) {
        local_25a = 1;
        pDVar8 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_258,"LWO: DIFF chunk is too small",&local_259)
        ;
        DeadlyImportError::DeadlyImportError(pDVar8,&local_258);
        local_25a = 0;
        __cxa_throw(pDVar8,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      fVar9 = GetF4(this);
      this_01->mDiffuseValue = fVar9;
    }
    else if (local_1e0.type == 0x474c4f53) {
      if (local_1e0.length < 4) {
        local_322 = 1;
        pDVar8 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_320,"LWO: GLOS chunk is too small",&local_321)
        ;
        DeadlyImportError::DeadlyImportError(pDVar8,&local_320);
        local_322 = 0;
        __cxa_throw(pDVar8,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      fVar9 = GetF4(this);
      this_01->mGlossiness = fVar9;
    }
    else if (local_1e0.type == 0x4c494e45) {
      if (local_1e0.length < 2) {
        local_2fa = 1;
        pDVar8 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_2f8,"LWO: LINE chunk is too small",&local_2f9)
        ;
        DeadlyImportError::DeadlyImportError(pDVar8,&local_2f8);
        local_2fa = 0;
        __cxa_throw(pDVar8,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      uVar3 = GetU2(this);
      if ((uVar3 & 1) != 0) {
        this_01->mWireframe = true;
      }
    }
    else if (local_1e0.type == 0x52494e44) {
      if (local_1e0.length < 4) {
        local_39a = 1;
        pDVar8 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_398,"LWO: RIND chunk is too small",&local_399)
        ;
        DeadlyImportError::DeadlyImportError(pDVar8,&local_398);
        local_39a = 0;
        __cxa_throw(pDVar8,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      fVar9 = GetF4(this);
      this_01->mIOR = fVar9;
    }
    else if (local_1e0.type == 0x53494445) {
      if (local_1e0.length < 2) {
        local_3c2 = 1;
        pDVar8 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_3c0,"LWO: SIDE chunk is too small",&local_3c1)
        ;
        DeadlyImportError::DeadlyImportError(pDVar8,&local_3c0);
        local_3c2 = 0;
        __cxa_throw(pDVar8,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      uVar3 = GetU2(this);
      this_01->bDoubleSided = uVar3 == 3;
    }
    else if (local_1e0.type == 0x534d414e) {
      if (local_1e0.length < 4) {
        local_3ea = 1;
        pDVar8 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_3e8,"LWO: SMAN chunk is too small",&local_3e9)
        ;
        DeadlyImportError::DeadlyImportError(pDVar8,&local_3e8);
        local_3ea = 0;
        __cxa_throw(pDVar8,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      fVar9 = GetF4(this);
      dVar10 = std::fabs((double)(ulong)(uint)fVar9);
      this_01->mMaximumSmoothAngle = SUB84(dVar10,0);
    }
    else if (local_1e0.type == 0x53504543) {
      if (local_1e0.length < 4) {
        local_282 = 1;
        pDVar8 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_280,"LWO: SPEC chunk is too small",&local_281)
        ;
        DeadlyImportError::DeadlyImportError(pDVar8,&local_280);
        local_282 = 0;
        __cxa_throw(pDVar8,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      fVar9 = GetF4(this);
      this_01->mSpecularValue = fVar9;
    }
    else if (local_1e0.type == 0x5452414e) {
      if ((this_01->mTransparency != 1e+11) || (NAN(this_01->mTransparency))) {
        if (local_1e0.length < 4) {
          local_2aa = 1;
          pDVar8 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_2a8,"LWO: TRAN chunk is too small",&local_2a9);
          DeadlyImportError::DeadlyImportError(pDVar8,&local_2a8);
          local_2aa = 0;
          __cxa_throw(pDVar8,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
        }
        fVar9 = GetF4(this);
        this_01->mTransparency = fVar9;
      }
    }
    else if (local_1e0.type == 0x56434f4c) {
      if (local_1e0.length < 0xc) {
        pDVar8 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_410,"LWO: VCOL chunk is too small",&local_411)
        ;
        DeadlyImportError::DeadlyImportError(pDVar8,&local_410);
        __cxa_throw(pDVar8,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      fVar9 = GetF4(this);
      this_01->mDiffuseValue = this_01->mDiffuseValue * fVar9;
      ReadVSizedIntLWO2(this,&this->mFileBuffer);
      uVar4 = GetU4(this);
      this_01->mVCMapType = uVar4;
      GetS0(this,&this_01->mVCMap,(int)local_210 - *(int *)&this->mFileBuffer);
    }
    this->mFileBuffer = local_210;
  }
  next._6_1_ = 1;
  pDVar8 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_200,"LWO2: Invalid surface chunk length",
             (allocator *)((long)&next + 7));
  DeadlyImportError::DeadlyImportError(pDVar8,&local_200);
  next._6_1_ = 0;
  __cxa_throw(pDVar8,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

void LWOImporter::LoadLWO2Surface(unsigned int size)
{
    LE_NCONST uint8_t* const end = mFileBuffer + size;

    mSurfaces->push_back( LWO::Surface () );
    LWO::Surface& surf = mSurfaces->back();

    GetS0(surf.mName,size);

    // check whether this surface was derived from any other surface
    std::string derived;
    GetS0(derived,(unsigned int)(end - mFileBuffer));
    if (derived.length())   {
        // yes, find this surface
        for (SurfaceList::iterator it = mSurfaces->begin(), end = mSurfaces->end()-1; it != end; ++it)  {
            if ((*it).mName == derived) {
                // we have it ...
                surf = *it;
                derived.clear();break;
            }
        }
        if (derived.size())
            ASSIMP_LOG_WARN("LWO2: Unable to find source surface: " + derived);
    }

    while (true)
    {
        if (mFileBuffer + 6 >= end)
            break;
        const IFF::SubChunkHeader head = IFF::LoadSubChunk(mFileBuffer);

        if (mFileBuffer + head.length > end)
            throw DeadlyImportError("LWO2: Invalid surface chunk length");

        uint8_t* const next = mFileBuffer+head.length;
        switch (head.type)
        {
            // diffuse color
        case AI_LWO_COLR:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,COLR,12);
                surf.mColor.r = GetF4();
                surf.mColor.g = GetF4();
                surf.mColor.b = GetF4();
                break;
            }
            // diffuse strength ... hopefully
        case AI_LWO_DIFF:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,DIFF,4);
                surf.mDiffuseValue = GetF4();
                break;
            }
            // specular strength ... hopefully
        case AI_LWO_SPEC:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,SPEC,4);
                surf.mSpecularValue = GetF4();
                break;
            }
            // transparency
        case AI_LWO_TRAN:
            {
                // transparency explicitly disabled?
                if (surf.mTransparency == 10e10f)
                    break;

                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,TRAN,4);
                surf.mTransparency = GetF4();
                break;
            }
            // additive transparency
        case AI_LWO_ADTR:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,ADTR,4);
                surf.mAdditiveTransparency = GetF4();
                break;
            }
            // wireframe mode
        case AI_LWO_LINE:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,LINE,2);
                if (GetU2() & 0x1)
                    surf.mWireframe = true;
                break;
            }
            // glossiness
        case AI_LWO_GLOS:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,GLOS,4);
                surf.mGlossiness = GetF4();
                break;
            }
            // bump intensity
        case AI_LWO_BUMP:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,BUMP,4);
                surf.mBumpIntensity = GetF4();
                break;
            }
            // color highlights
        case AI_LWO_CLRH:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,CLRH,4);
                surf.mColorHighlights = GetF4();
                break;
            }
            // index of refraction
        case AI_LWO_RIND:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,RIND,4);
                surf.mIOR = GetF4();
                break;
            }
            // polygon sidedness
        case AI_LWO_SIDE:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,SIDE,2);
                surf.bDoubleSided = (3 == GetU2());
                break;
            }
            // maximum smoothing angle
        case AI_LWO_SMAN:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,SMAN,4);
                surf.mMaximumSmoothAngle = std::fabs( GetF4() );
                break;
            }
            // vertex color channel to be applied to the surface
        case AI_LWO_VCOL:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,VCOL,12);
                surf.mDiffuseValue *= GetF4();              // strength
                ReadVSizedIntLWO2(mFileBuffer);             // skip envelope
                surf.mVCMapType = GetU4();                  // type of the channel

                // name of the channel
                GetS0(surf.mVCMap, (unsigned int) (next - mFileBuffer ));
                break;
            }
            // surface bock entry
        case AI_LWO_BLOK:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,BLOK,4);
                IFF::SubChunkHeader head2 = IFF::LoadSubChunk(mFileBuffer);

                switch (head2.type)
                {
                case AI_LWO_PROC:
                case AI_LWO_GRAD:
                case AI_LWO_IMAP:
                    LoadLWO2TextureBlock(&head2, head.length);
                    break;
                case AI_LWO_SHDR:
                    LoadLWO2ShaderBlock(&head2, head.length);
                    break;

                default:
                    ASSIMP_LOG_WARN("LWO2: Found an unsupported surface BLOK");
                };

                break;
            }
        }
        mFileBuffer = next;
    }
}